

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_fs_open(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int64_t eval_b_3;
  int64_t eval_b_4;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  undefined1 local_488 [16];
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_write_t write_req2;
  uv_write_t write_req;
  uv_pipe_t in;
  uv_fs_t fs_req;
  
  builtin_strncpy(dev_null,"/dev/null",10);
  iVar1 = uv_fs_open(0,&fs_req,dev_null,2,0,0);
  eval_b_3 = (int64_t)iVar1;
  write_req.data = (void *)0x0;
  in.data = (void *)eval_b_3;
  if ((void *)eval_b_3 == (void *)0x0) {
    fd = (int)fs_req.result;
    init_process_options("spawn_helper8",exit_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,(uv_stream_t *)&in,0);
    write_req.data = (void *)(long)iVar1;
    write_req2.data = (void *)0x0;
    if (write_req.data == (void *)0x0) {
      options.stdio = stdio;
      stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
      options.stdio_count = 1;
      stdio[0].data.stream = (uv_stream_t *)&in;
      dup_fd = dup((int)fs_req.result);
      uVar2 = uv_default_loop();
      iVar1 = uv_spawn(uVar2,&process,&options);
      write_req.data = (void *)(long)iVar1;
      write_req2.data = (void *)0x0;
      if (write_req.data == (void *)0x0) {
        local_488 = uv_buf_init(&fd,4);
        iVar1 = uv_write(&write_req,&in,local_488,1,write_null_cb);
        write_req2.data = (void *)(long)iVar1;
        if (write_req2.data == (void *)0x0) {
          auVar5 = uv_buf_init(&dup_fd,4);
          local_488 = auVar5;
          iVar1 = uv_write(&write_req2,&in,local_488,1,write_cb);
          eval_b_3 = (int64_t)iVar1;
          eval_b_4 = 0;
          if ((void *)eval_b_3 == (void *)0x0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_b_3 = (int64_t)iVar1;
            eval_b_4 = 0;
            if ((void *)eval_b_3 == (void *)0x0) {
              iVar1 = uv_fs_close(0,&fs_req,fd,0);
              eval_b_3 = (int64_t)iVar1;
              eval_b_4 = 0;
              if ((void *)eval_b_3 == (void *)0x0) {
                eval_b_3 = 1;
                eval_b_4 = (int64_t)exit_cb_called;
                if (eval_b_4 == 1) {
                  eval_b_3 = 2;
                  eval_b_4 = (int64_t)close_cb_called;
                  if (eval_b_4 == 2) {
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    eval_b_3 = 0;
                    uVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar2);
                    eval_b_4 = (int64_t)iVar1;
                    if (eval_b_4 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar4 = "uv_loop_close(uv_default_loop())";
                    pcVar3 = "0";
                    uVar2 = 0x72e;
                  }
                  else {
                    pcVar4 = "close_cb_called";
                    pcVar3 = "2";
                    uVar2 = 0x72c;
                  }
                }
                else {
                  pcVar4 = "exit_cb_called";
                  pcVar3 = "1";
                  uVar2 = 0x72b;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_fs_close(((void*)0), &fs_req, fd, ((void*)0))";
                uVar2 = 0x729;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uVar2 = 0x728;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb)";
            uVar2 = 0x726;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb)";
          uVar2 = 0x723;
          eval_b_4 = 0;
          eval_b_3 = (int64_t)write_req2.data;
        }
        goto LAB_0017c1e1;
      }
      pcVar3 = "uv_spawn(uv_default_loop(), &process, &options)";
      uVar2 = 0x71c;
    }
    else {
      pcVar3 = "uv_pipe_init(uv_default_loop(), &in, 0)";
      uVar2 = 0x707;
    }
    write_req2.data = (void *)0x0;
    pcVar4 = "0";
    eval_b_4 = 0;
    eval_b_3 = (int64_t)write_req.data;
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x702;
    eval_b_4 = 0;
  }
LAB_0017c1e1:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_3,"==",eval_b_4);
  abort();
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  fd = (uv_os_fd_t) fs_req.result;

  init_process_options("spawn_helper8", exit_cb);

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT_NE(0, DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                               0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT_NE(pCompareObjectHandles == NULL ||
            pCompareObjectHandles(fd, dup_fd),
            0);
#else
  dup_fd = dup(fd);
#endif

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &in,
                     &buf,
                     1,
                     write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT_OK(uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_OK(uv_fs_close(NULL, &fs_req, fd, NULL));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}